

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O3

TestObject * __thiscall StressTester::CreateRandom(StressTester *this)

{
  Recycler *recycler;
  TestObject *val;
  long lVar1;
  int iVar2;
  int iVar3;
  TestObject *pTVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 *puVar7;
  undefined8 auStack_50 [2];
  ulong local_40;
  ulong local_38;
  
  auStack_50[0] = 0x7518c1;
  iVar2 = PAL_rand();
  uVar6 = iVar2 % 5000;
  local_40 = (ulong)uVar6;
  uVar5 = (long)(int)uVar6 * 8 + 0x37U & 0xfffffffffffffff0;
  lVar1 = -uVar5;
  puVar7 = (undefined8 *)((ulong)(&stack0xffffffffffffffd7 + -uVar5) & 0xffffffffffffffe0);
  if (-1 < (int)uVar6) {
    uVar6 = iVar2 % 5000 + 1;
    local_38 = (ulong)uVar6;
    uVar5 = 0;
    do {
      recycler = this->recycler;
      *(undefined8 *)((long)auStack_50 + lVar1) = 0x75192d;
      iVar2 = PAL_rand();
      *(undefined8 *)((long)auStack_50 + lVar1) = 0x75193f;
      pTVar4 = TestObject::Create(recycler,10,(long)iVar2,NormalObj);
      puVar7[uVar5] = pTVar4;
      uVar5 = uVar5 + 1;
    } while (local_38 != uVar5);
    if (-1 < (int)local_40) {
      uVar5 = 0;
      do {
        iVar2 = 5;
        do {
          pTVar4 = (TestObject *)puVar7[uVar5];
          *(undefined8 *)((long)auStack_50 + lVar1) = 0x751967;
          iVar3 = PAL_rand();
          val = (TestObject *)puVar7[iVar3 % (int)uVar6];
          *(undefined8 *)((long)auStack_50 + lVar1) = 0x75197a;
          TestObject::SetRandom(pTVar4,val);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_38);
    }
  }
  return (TestObject *)*puVar7;
}

Assistant:

TestObject *StressTester::CreateRandom()
{
    int numObjects = rand() % 5000 + 1;

    void *memory = _alloca(numObjects * sizeof(TestObject*)+OBJALIGN);
    TestObject **objs = reinterpret_cast<TestObject**>(AlignPtr(memory, OBJALIGN));

    // Create the objects
    for (int i = 0; i < numObjects; ++i)
    {
        objs[i] = TestObject::Create(recycler, 10, rand());
    }

    // Create links between objects
    for (int i = 0; i < numObjects; ++i)
    {
        for (int j = 0; j < 5; ++j)
        {
            objs[i]->SetRandom(objs[rand() % numObjects]);
        }
    }

    return objs[0];
}